

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirePdu.cpp
# Opt level: O1

bool __thiscall DIS::FirePdu::operator==(FirePdu *this,FirePdu *rhs)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  bVar3 = WarfareFamilyPdu::operator==(&this->super_WarfareFamilyPdu,&rhs->super_WarfareFamilyPdu);
  bVar4 = EntityID::operator==(&this->_munitionExpendibleID,&rhs->_munitionExpendibleID);
  bVar5 = EventIdentifier::operator==(&this->_eventID,&rhs->_eventID);
  uVar2 = this->_fireMissionIndex;
  uVar1 = rhs->_fireMissionIndex;
  bVar6 = Vector3Double::operator==
                    (&this->_locationInWorldCoordinates,&rhs->_locationInWorldCoordinates);
  bVar7 = MunitionDescriptor::operator==(&this->_descriptor,&rhs->_descriptor);
  bVar8 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  return ((bVar8 && (bVar7 && bVar6)) && ((bVar5 && (bVar4 && bVar3)) && uVar2 == uVar1)) &&
         this->_range == rhs->_range;
}

Assistant:

bool FirePdu::operator ==(const FirePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = WarfareFamilyPdu::operator==(rhs);

     if( ! (_munitionExpendibleID == rhs._munitionExpendibleID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_fireMissionIndex == rhs._fireMissionIndex) ) ivarsEqual = false;
     if( ! (_locationInWorldCoordinates == rhs._locationInWorldCoordinates) ) ivarsEqual = false;
     if( ! (_descriptor == rhs._descriptor) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;
     if( ! (_range == rhs._range) ) ivarsEqual = false;

    return ivarsEqual;
 }